

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_5_normal_or_postfix_stmt
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_UNTIL,G->val[-1],G->val[-4]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_5_normal_or_postfix_stmt(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define cond_for G->val[-1]
#define cond_unless G->val[-2]
#define cond_if G->val[-3]
#define n G->val[-4]
  yyprintf((stderr, "do yy_5_normal_or_postfix_stmt"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_UNTIL, cond_for, n); }\n"));
  yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_UNTIL, cond_for, n); ;
#undef cond_for
#undef cond_unless
#undef cond_if
#undef n
}